

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O1

bool __thiscall test_CECoordinates::test_Convert2Observed(test_CECoordinates *this)

{
  CEDate *this_00;
  CEObserver *this_01;
  CECoordinates *pCVar1;
  CECoordinates *this_02;
  double dVar2;
  undefined1 uVar3;
  CECoordinates obs2obs;
  double zen;
  double az;
  CECoordinates gal2obs;
  CECoordinates icrs2obs;
  CECoordinates testobs;
  CECoordinates cirs2obs;
  allocator local_1a5;
  CECoordinateType local_1a4;
  double local_1a0;
  double local_198;
  CECoordinates local_190;
  double local_160;
  double local_158;
  CEAngle local_150 [2];
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  CECoordinates local_f0;
  CECoordinates local_c0;
  CECoordinates local_90;
  CECoordinates local_60;
  
  local_158 = 0.0;
  local_160 = 0.0;
  CECoordinates::CECoordinates(&local_90);
  this_00 = &this->base_date_;
  local_198 = CEDate::operator_cast_to_double(this_00);
  this_01 = &this->base_observer_;
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_cirs_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&local_60,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"test_Convert2Observed",(allocator *)&local_190);
  this_02 = &this->base_obs_;
  local_f0._vptr_CECoordinates._0_4_ = 0x19d;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_02,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_190);
  CECoordinates::GetObservedCoords(&local_c0,pCVar1,this_00,this_01);
  CECoordinates::operator=(&local_60,&local_c0);
  CECoordinates::~CECoordinates(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"test_Convert2Observed",(allocator *)&local_190);
  local_f0._vptr_CECoordinates._0_4_ = 0x1a0;
  (**(code **)(*(long *)this + 200))(this,&local_60,this_02,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_190);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  local_c0._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::CIRS2Observed
            (local_198,local_1a0,&local_158,&local_160,this_00,this_01,(CEAngleType *)&local_c0,
             dVar2,(double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&local_c0,&local_158);
  CEAngle::Deg((CEAngle *)&local_f0,&local_160);
  local_190._vptr_CECoordinates._0_4_ = 3;
  CECoordinates::SetCoordinates
            (&local_90,(CEAngle *)&local_c0,(CEAngle *)&local_f0,(CECoordinateType *)&local_190);
  CEAngle::~CEAngle((CEAngle *)&local_f0);
  CEAngle::~CEAngle((CEAngle *)&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"test_Convert2Observed",(allocator *)&local_190);
  local_f0._vptr_CECoordinates._0_4_ = 0x1aa;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_02,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_190);
  local_198 = CEDate::operator_cast_to_double(this_00);
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_icrs_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&local_c0,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"test_Convert2Observed",(allocator *)local_150);
  local_190._vptr_CECoordinates._0_4_ = 0x1b9;
  (**(code **)(*(long *)this + 200))(this,&local_c0,this_02,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  CECoordinates::GetObservedCoords(&local_f0,pCVar1,this_00,this_01);
  CECoordinates::operator=(&local_c0,&local_f0);
  CECoordinates::~CECoordinates(&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"test_Convert2Observed",(allocator *)local_150);
  local_190._vptr_CECoordinates._0_4_ = 0x1bc;
  (**(code **)(*(long *)this + 200))(this,&local_c0,this_02,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  local_f0._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ICRS2Observed
            (local_198,local_1a0,&local_158,&local_160,this_00,this_01,(CEAngleType *)&local_f0,
             dVar2,(double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&local_f0,&local_158);
  CEAngle::Deg((CEAngle *)&local_190,&local_160);
  local_150[0]._vptr_CEAngle._0_4_ = 3;
  CECoordinates::SetCoordinates
            (&local_90,(CEAngle *)&local_f0,(CEAngle *)&local_190,(CECoordinateType *)local_150);
  CEAngle::~CEAngle((CEAngle *)&local_190);
  CEAngle::~CEAngle((CEAngle *)&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"test_Convert2Observed",(allocator *)local_150);
  local_190._vptr_CECoordinates._0_4_ = 0x1c6;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_02,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  local_198 = CEDate::operator_cast_to_double(this_00);
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_gal_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&local_f0,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"test_Convert2Observed",(allocator *)&local_1a4)
  ;
  local_150[0]._vptr_CEAngle._0_4_ = 0x1d5;
  (**(code **)(*(long *)this + 200))(this,&local_f0,this_02,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  CECoordinates::GetObservedCoords(&local_190,pCVar1,this_00,this_01);
  CECoordinates::operator=(&local_f0,&local_190);
  CECoordinates::~CECoordinates(&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"test_Convert2Observed",(allocator *)&local_1a4)
  ;
  local_150[0]._vptr_CEAngle._0_4_ = 0x1d8;
  (**(code **)(*(long *)this + 200))(this,&local_f0,this_02,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  local_190._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::Galactic2Observed
            (local_198,local_1a0,&local_158,&local_160,this_00,this_01,(CEAngleType *)&local_190,
             dVar2,(double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&local_190,&local_158);
  CEAngle::Deg(local_150,&local_160);
  local_1a4 = OBSERVED;
  CECoordinates::SetCoordinates(&local_90,(CEAngle *)&local_190,local_150,&local_1a4);
  CEAngle::~CEAngle(local_150);
  CEAngle::~CEAngle((CEAngle *)&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"test_Convert2Observed",(allocator *)&local_1a4)
  ;
  local_150[0]._vptr_CEAngle._0_4_ = 0x1e2;
  (**(code **)(*(long *)this + 200))(this,&local_90,this_02,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  dVar2 = CEDate::CurrentJD();
  CECoordinates::ConvertToObserved
            (&local_190,this_02,dVar2,0.0,0.0,0.0,-1.0,-1000.0,0.0,0.0,0.0,0.0,0.5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"test_Convert2Observed",&local_1a5);
  local_1a4 = 0x1e7;
  (**(code **)(*(long *)this + 0x48))(this,0,local_150);
  std::__cxx11::string::~string((string *)local_150);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a5);
  CECoordinates::~CECoordinates(&local_190);
  CECoordinates::GetObservedCoords(&local_190,this_02,this_00,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"test_Convert2Observed",&local_1a5);
  local_1a4 = 0x1ed;
  (**(code **)(*(long *)this + 200))(this,&local_190,this_02,local_150);
  std::__cxx11::string::~string((string *)local_150);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a5);
  uVar3 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&local_190);
  CECoordinates::~CECoordinates(&local_f0);
  CECoordinates::~CECoordinates(&local_c0);
  CECoordinates::~CECoordinates(&local_60);
  CECoordinates::~CECoordinates(&local_90);
  return (bool)uVar3;
}

Assistant:

bool test_CECoordinates::test_Convert2Observed()
{
    // preliminary variables for observer based conversion
    double az(0.0);
    double zen(0.0);
    CECoordinates testobs;

    // CIRS -> Observed
    CECoordinates cirs2obs = base_cirs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    cirs2obs = base_cirs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::CIRS2Observed(base_cirs_.XCoordinate_Deg(),
                                 base_cirs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // ICRS -> Observed
    CECoordinates icrs2obs = base_icrs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    icrs2obs = base_icrs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::ICRS2Observed(base_icrs_.XCoordinate_Deg(),
                                 base_icrs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Galactic -> Observed
    CECoordinates gal2obs = base_gal_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    gal2obs = base_gal_.GetObservedCoords(base_date_, base_observer_);
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::Galactic2Observed(base_gal_.XCoordinate_Deg(),
                                     base_gal_.YCoordinate_Deg(),
                                     &az, &zen,
                                     base_date_, base_observer_, 
                                     CEAngleType::DEGREES,
                                     base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Observed -> Observed
    try {
        CECoordinates obs2obs = base_obs_.ConvertToObserved();
        test(false, __func__, __LINE__);
    } catch (std::exception &e) {
        test(true, __func__, __LINE__);
    }
    // 'GetObservedCoords' method
    CECoordinates obs2obs = base_obs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(obs2obs, base_obs_, __func__, __LINE__);

    return pass();
}